

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

int __thiscall
fmt::v10::basic_format_parse_context<char>::next_arg_id(basic_format_parse_context<char> *this)

{
  int id_00;
  int id;
  basic_format_parse_context<char> *this_local;
  
  if (this->next_arg_id_ < 0) {
    v10::detail::throw_format_error("cannot switch from manual to automatic argument indexing");
  }
  id_00 = this->next_arg_id_;
  this->next_arg_id_ = id_00 + 1;
  do_check_arg_id(this,id_00);
  return id_00;
}

Assistant:

FMT_CONSTEXPR auto next_arg_id() -> int {
    if (next_arg_id_ < 0) {
      detail::throw_format_error(
          "cannot switch from manual to automatic argument indexing");
      return 0;
    }
    int id = next_arg_id_++;
    do_check_arg_id(id);
    return id;
  }